

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_clear(void)

{
  uint uVar1;
  int iVar2;
  term_win *ptVar3;
  int **ppiVar4;
  wchar_t **ppwVar5;
  int **ppiVar6;
  wchar_t **ppwVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  wchar_t *pwVar11;
  int *piVar12;
  wchar_t *pwVar13;
  term *ptVar14;
  ulong uVar15;
  long lVar16;
  
  ptVar14 = Term;
  uVar1 = Term->wid;
  iVar2 = Term->hgt;
  ptVar3 = Term->scr;
  ptVar3->cu = false;
  ptVar3->cx = 0;
  ptVar3->cy = 0;
  if (0 < (long)iVar2) {
    ppiVar4 = ptVar3->a;
    ppwVar5 = ptVar3->c;
    ppiVar6 = ptVar3->ta;
    ppwVar7 = ptVar3->tc;
    piVar8 = ptVar14->x1;
    piVar9 = ptVar14->x2;
    lVar16 = 0;
    do {
      if (0 < (int)uVar1) {
        piVar10 = ppiVar4[lVar16];
        pwVar11 = ppwVar5[lVar16];
        piVar12 = ppiVar6[lVar16];
        pwVar13 = ppwVar7[lVar16];
        uVar15 = 0;
        do {
          piVar10[uVar15] = 1;
          pwVar11[uVar15] = L' ';
          piVar12[uVar15] = 0;
          pwVar13[uVar15] = L'\0';
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      piVar8[lVar16] = 0;
      piVar9[lVar16] = uVar1 - 1;
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar2);
  }
  ptVar14->y1 = 0;
  ptVar14->y2 = iVar2 + -1;
  ptVar14->total_erase = true;
  return 0;
}

Assistant:

errr Term_clear(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	/* Cursor usable */
	Term->scr->cu = 0;

	/* Cursor to the top left */
	Term->scr->cx = Term->scr->cy = 0;

	/* Wipe each row */
	for (y = 0; y < h; y++) {
		int *scr_aa = Term->scr->a[y];
		wchar_t *scr_cc = Term->scr->c[y];
		int *scr_taa = Term->scr->ta[y];
		wchar_t *scr_tcc = Term->scr->tc[y];

		/* Wipe each column */
		for (x = 0; x < w; x++) {
			scr_aa[x] = COLOUR_WHITE;
			scr_cc[x] = ' ';

			scr_taa[x] = 0;
			scr_tcc[x] = 0;
		}

		/* This row has changed */
		Term->x1[y] = 0;
		Term->x2[y] = w - 1;
	}

	/* Every row has changed */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Success */
	return (0);
}